

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cc
# Opt level: O0

Range * re2c::Range::add(Range *r1,Range *r2)

{
  Range *local_28;
  Range *tail;
  Range *head;
  Range *r2_local;
  Range *r1_local;
  
  tail = (Range *)0x0;
  local_28 = (Range *)0x0;
  head = r2;
  r2_local = r1;
  while (r2_local != (Range *)0x0 && head != (Range *)0x0) {
    if (r2_local->lb < head->lb) {
      append_overlapping(&tail,&local_28,r2_local);
      r2_local = r2_local->nx;
    }
    else {
      append_overlapping(&tail,&local_28,head);
      head = head->nx;
    }
  }
  for (; r2_local != (Range *)0x0; r2_local = r2_local->nx) {
    append_overlapping(&tail,&local_28,r2_local);
  }
  for (; head != (Range *)0x0; head = head->nx) {
    append_overlapping(&tail,&local_28,head);
  }
  return tail;
}

Assistant:

Range * Range::add (const Range * r1, const Range * r2)
{
	Range * head = NULL;
	Range * tail = NULL;
	for (; r1 && r2;)
	{
		if (r1->lb < r2->lb)
		{
			append_overlapping (head, tail, r1);
			r1 = r1->nx;
		}
		else
		{
			append_overlapping (head, tail, r2);
			r2 = r2->nx;
		}
	}
	for (; r1; r1 = r1->nx)
	{
		append_overlapping (head, tail, r1);
	}
	for (; r2; r2 = r2->nx)
	{
		append_overlapping (head, tail, r2);
	}
	return head;
}